

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk94(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk94 *peVar4;
  envy_bios_power_unk94_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk94 *unk94;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk94;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk94.version);
    if ((bios->power).unk94.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk94.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk94.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk94.entriesnum);
      (bios->power).unk94.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk94_entry *)malloc((ulong)(bios->power).unk94.entriesnum << 2);
      (bios->power).unk94.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk94.entriesnum; data = data + 1) {
        (bios->power).unk94.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk94.hlen + data * (bios->power).unk94.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERM MONITOR table version 0x%x\n",
              (ulong)(bios->power).unk94.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk94(struct envy_bios *bios) {
	struct envy_bios_power_unk94 *unk94 = &bios->power.unk94;
	int i, err = 0;

	if (!unk94->offset)
		return -EINVAL;

	bios_u8(bios, unk94->offset + 0x0, &unk94->version);
	switch(unk94->version) {
	case 0x10:
		err |= bios_u8(bios, unk94->offset + 0x1, &unk94->hlen);
		err |= bios_u8(bios, unk94->offset + 0x2, &unk94->rlen);
		err |= bios_u8(bios, unk94->offset + 0x3, &unk94->entriesnum);
		unk94->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERM MONITOR table version 0x%x\n", unk94->version);
		return -EINVAL;
	};

	err = 0;
	unk94->entries = malloc(unk94->entriesnum * sizeof(struct envy_bios_power_unk94_entry));
	for (i = 0; i < unk94->entriesnum; i++) {
		uint32_t data = unk94->offset + unk94->hlen + i * unk94->rlen;

		unk94->entries[i].offset = data;
	}

	return 0;
}